

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O1

photonstream * __thiscall
NEST::NESTcalc::GetPhotonTimes
          (photonstream *__return_storage_ptr__,NESTcalc *this,INTERACTION_TYPE species,
          int total_photons,int excitons,double dfield,double energy)

{
  iterator __position;
  runtime_error *this_00;
  int iVar1;
  double local_38;
  
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (excitons <= total_photons) {
    if (0 < total_photons) {
      iVar1 = 0;
      do {
        local_38 = PhotonTime(this,species,iVar1 < excitons,dfield,energy);
        __position._M_current =
             (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (__return_storage_ptr__,__position,&local_38);
        }
        else {
          *__position._M_current = local_38;
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        iVar1 = iVar1 + 1;
      } while (total_photons != iVar1);
    }
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,
             "You specified more excitons than total photon numbers?! This is physically wrong and please check your inputs."
            );
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

photonstream NESTcalc::GetPhotonTimes(INTERACTION_TYPE species,
                                      int total_photons, int excitons,
                                      double dfield, double energy) {
  photonstream return_photons;
  int total, excit;
	
  if (excitons > total_photons) {
    throw std::runtime_error("You specified more excitons than total photon numbers?! This is physically wrong and please check your inputs.");
  }
	
  for (int ip = 0; ip < total_photons; ++ip) {
    bool isExciton = false;
    if (ip < excitons) isExciton = true;
    // message from Matthew: please stop telling me next line bad. I can't skip
    // PhotonTime, it's a func not array
    return_photons.emplace_back(PhotonTime(species, isExciton, dfield, energy));
  }

  return return_photons;
}